

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse.array.c
# Opt level: O3

void pnga_sprs_array_row_distribution(Integer s_a,Integer iproc,Integer *lo,Integer *hi)

{
  long lVar1;
  long lVar2;
  _sparse_array *p_Var3;
  Integer IVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  
  p_Var3 = SPA;
  lVar8 = s_a + 1000;
  *lo = SPA[lVar8].ilo;
  IVar4 = pnga_pgroup_nodeid(p_Var3[lVar8].grp);
  p_Var3 = SPA;
  if (IVar4 == iproc) {
    *lo = SPA[lVar8].ilo;
    IVar4 = p_Var3[lVar8].ihi;
  }
  else {
    lVar1 = SPA[lVar8].idim;
    lVar2 = SPA[lVar8].nprocs;
    lVar5 = (lVar1 * iproc) / lVar2;
    lVar8 = lVar5 + -1;
    lVar7 = (lVar5 + -2) * lVar2;
    lVar5 = lVar5 * lVar2;
    do {
      lVar6 = lVar5 / lVar1;
      lVar7 = lVar7 + lVar2;
      lVar8 = lVar8 + 1;
      lVar5 = lVar5 + lVar2;
    } while (lVar6 < iproc);
    *lo = lVar8;
    if (iproc < lVar6) {
      do {
        lVar8 = lVar8 + -1;
        lVar5 = lVar7 / lVar1;
        lVar7 = lVar7 - lVar2;
      } while (iproc < lVar5);
      *lo = lVar8;
    }
    lVar8 = lVar1;
    if (iproc < lVar2 + -1) {
      lVar7 = (lVar1 * (iproc + 1)) / lVar2;
      lVar8 = lVar7 + -1;
      lVar5 = (lVar7 + -2) * lVar2;
      lVar7 = lVar7 * lVar2;
      do {
        lVar6 = lVar7 / lVar1;
        lVar5 = lVar5 + lVar2;
        lVar8 = lVar8 + 1;
        lVar7 = lVar7 + lVar2;
      } while (lVar6 <= iproc);
      while (iproc + 1 < lVar6) {
        lVar8 = lVar8 + -1;
        lVar6 = lVar5 / lVar1;
        lVar5 = lVar5 - lVar2;
      }
    }
    IVar4 = lVar8 + -1;
  }
  *hi = IVar4;
  return;
}

Assistant:

void pnga_sprs_array_row_distribution(Integer s_a, Integer iproc, Integer *lo,
    Integer *hi)
{
  Integer hdl = GA_OFFSET + s_a;
  *lo = SPA[hdl].ilo;
  if (iproc == pnga_pgroup_nodeid(SPA[hdl].grp)) {
    *lo = SPA[hdl].ilo;
    *hi = SPA[hdl].ihi;
  } else {
    Integer nproc = SPA[hdl].nprocs;
    Integer idim = SPA[hdl].idim;
    *lo = (SPA[hdl].idim*iproc)/nproc;
    while (((*lo)*nproc)/idim < iproc) {
      (*lo)++;
    }
    while (((*lo)*nproc)/idim > iproc) {
      (*lo)--;
    }
    if (iproc < nproc-1) {
      (*hi) = (idim*(iproc+1))/nproc;
      while (((*hi)*nproc)/idim < iproc+1) {
        (*hi)++;
      }
      while (((*hi)*nproc)/idim > iproc+1) {
        (*hi)--;
      }
      (*hi)--;
    } else {
      *hi = idim-1;
    }
  }
}